

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TaggedPattern * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TaggedPattern,slang::ast::FieldSymbol_const&,slang::ast::Pattern_const*&,slang::SourceRange>
          (BumpAllocator *this,FieldSymbol *args,Pattern **args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  TaggedPattern *pTVar1;
  Pattern *in_RCX;
  FieldSymbol *in_RDX;
  TaggedPattern *in_RSI;
  SourceLocation in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pTVar1 = (TaggedPattern *)
           allocate((BumpAllocator *)in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  ast::TaggedPattern::TaggedPattern(in_RSI,in_RDX,in_RCX,sourceRange);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }